

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

int __thiscall
QTextCursor::select(QTextCursor *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                   fd_set *__exceptfds,timeval *__timeout)

{
  bool bVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  MoveOperation op;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr != (QTextCursorPrivate *)0x0) &&
     (pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d),
     pQVar3->priv != (QTextDocumentPrivate *)0x0)) {
    clearSelection(this);
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    QTextCursorPrivate::block((QTextCursorPrivate *)local_38);
    switch(__nfds) {
    case 0:
      movePosition(this,StartOfWord,MoveAnchor,1);
      op = EndOfWord;
      break;
    case 1:
      movePosition(this,StartOfLine,MoveAnchor,1);
      op = EndOfLine;
      break;
    case 2:
      iVar2 = QTextBlock::length((QTextBlock *)local_38);
      if (iVar2 == 1) goto switchD_0044d385_default;
      movePosition(this,StartOfBlock,MoveAnchor,1);
      bVar1 = movePosition(this,PreviousBlock,MoveAnchor,1);
      op = EndOfBlock;
      if (bVar1) {
        movePosition(this,EndOfBlock,MoveAnchor,1);
        movePosition(this,NextBlock,KeepAnchor,1);
      }
      break;
    case 3:
      movePosition(this,Start,MoveAnchor,1);
      op = End;
      break;
    default:
      goto switchD_0044d385_default;
    }
    movePosition(this,op,KeepAnchor,1);
  }
switchD_0044d385_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextCursor::select(SelectionType selection)
{
    if (!d || !d->priv)
        return;

    clearSelection();

    const QTextBlock block = d->block();

    switch (selection) {
        case LineUnderCursor:
            movePosition(StartOfLine);
            movePosition(EndOfLine, KeepAnchor);
            break;
        case WordUnderCursor:
            movePosition(StartOfWord);
            movePosition(EndOfWord, KeepAnchor);
            break;
        case BlockUnderCursor:
            if (block.length() == 1) // no content
                break;
            movePosition(StartOfBlock);
            // also select the paragraph separator
            if (movePosition(PreviousBlock)) {
                movePosition(EndOfBlock);
                movePosition(NextBlock, KeepAnchor);
            }
            movePosition(EndOfBlock, KeepAnchor);
            break;
        case Document:
            movePosition(Start);
            movePosition(End, KeepAnchor);
            break;
    }
}